

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O1

spvc_result
spvc_compiler_get_combined_image_samplers
          (spvc_compiler compiler,spvc_combined_image_sampler **samplers,size_t *num_samplers)

{
  uint32_t uVar1;
  spvc_context psVar2;
  size_t sVar3;
  VariableID VVar4;
  VariableID VVar5;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var6;
  CombinedImageSampler *c;
  CombinedImageSampler *pCVar7;
  CombinedImageSampler *pCVar8;
  SmallVector<spvc_combined_image_sampler,_8UL> translated;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> combined;
  undefined1 local_128 [128];
  undefined1 local_a8 [120];
  
  local_a8._0_8_ = local_a8 + 0x18;
  local_a8._8_8_ = 0;
  local_a8._16_8_ = 8;
  spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,_8UL>::operator=
            ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)local_a8,
             &((compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl)->
              combined_image_samplers);
  local_128._0_8_ = local_128 + 0x18;
  local_128._8_8_ = 0;
  local_128._16_8_ = 8;
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::reserve
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)local_128,local_a8._8_8_);
  if (local_a8._8_8_ != 0) {
    pCVar8 = (CombinedImageSampler *)(local_a8._0_8_ + local_a8._8_8_ * 0xc);
    pCVar7 = (CombinedImageSampler *)local_a8._0_8_;
    do {
      VVar4.id = (pCVar7->combined_id).id;
      VVar5.id = (pCVar7->image_id).id;
      uVar1 = (pCVar7->sampler_id).id;
      spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::reserve
                ((SmallVector<spvc_combined_image_sampler,_8UL> *)local_128,local_128._8_8_ + 1);
      ((spvc_combined_image_sampler *)(local_128._0_8_ + local_128._8_8_ * 0xc))->combined_id =
           VVar4.id;
      ((spvc_combined_image_sampler *)(local_128._0_8_ + local_128._8_8_ * 0xc))->image_id =
           VVar5.id;
      ((spvc_combined_image_sampler *)(local_128._0_8_ + local_128._8_8_ * 0xc))->sampler_id = uVar1
      ;
      local_128._8_8_ = local_128._8_8_ + 1;
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar8);
  }
  _Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)operator_new(0x80);
  *(undefined8 *)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x68) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined ***)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       &PTR__TemporaryBuffer_003a8b20;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 **)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
       (undefined8 *)
       ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20);
  *(undefined8 *)
   ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 8;
  spirv_cross::SmallVector<spvc_combined_image_sampler,_8UL>::operator=
            ((SmallVector<spvc_combined_image_sampler,_8UL> *)
             ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8),
             (SmallVector<spvc_combined_image_sampler,_8UL> *)local_128);
  *samplers = *(spvc_combined_image_sampler **)
               ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8
               );
  *num_samplers =
       *(size_t *)
        ((long)_Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10);
  psVar2 = compiler->context;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
  ::reserve(&psVar2->allocations,
            (psVar2->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size + 1);
  sVar3 = (psVar2->allocations).
          super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
          .buffer_size;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .ptr[sVar3]._M_t.
  super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>._M_t
  .super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>.
  super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
       _Var6.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
  (psVar2->allocations).
  super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
  .buffer_size = sVar3 + 1;
  local_128._8_8_ = 0;
  if ((spvc_combined_image_sampler *)local_128._0_8_ !=
      (spvc_combined_image_sampler *)(local_128 + 0x18)) {
    free((void *)local_128._0_8_);
  }
  local_a8._8_8_ = 0;
  if ((CombinedImageSampler *)local_a8._0_8_ != (CombinedImageSampler *)(local_a8 + 0x18)) {
    free((void *)local_a8._0_8_);
  }
  return SPVC_SUCCESS;
}

Assistant:

spvc_result spvc_compiler_get_combined_image_samplers(spvc_compiler compiler,
                                                      const spvc_combined_image_sampler **samplers,
                                                      size_t *num_samplers)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto combined = compiler->compiler->get_combined_image_samplers();
		SmallVector<spvc_combined_image_sampler> translated;
		translated.reserve(combined.size());
		for (auto &c : combined)
		{
			spvc_combined_image_sampler trans = { c.combined_id, c.image_id, c.sampler_id };
			translated.push_back(trans);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_combined_image_sampler>>();
		ptr->buffer = std::move(translated);
		*samplers = ptr->buffer.data();
		*num_samplers = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}